

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O0

int __thiscall
ncnn::MemoryData::forward
          (MemoryData *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *param_2,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  int in_ECX;
  undefined4 in_register_0000000c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  Mat *in_RDI;
  void *in_R8;
  Mat *top_blob;
  Mat *this_00;
  Mat local_70;
  reference local_30;
  long local_28;
  int local_4;
  
  local_28 = CONCAT44(in_register_0000000c,in_ECX);
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  this_00 = &local_70;
  Mat::clone(this_00,(__fn *)&in_RDI[3].refcount,*(void **)(local_28 + 8),in_ECX,in_R8);
  Mat::operator=(this_00,in_RDI);
  Mat::~Mat((Mat *)0x1514c0);
  bVar1 = Mat::empty(in_RDI);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MemoryData::forward(const std::vector<Mat>& /*bottom_blobs*/, std::vector<Mat>& top_blobs, const Option& opt) const
{
    Mat& top_blob = top_blobs[0];

    top_blob = data.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    return 0;
}